

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_path_extension_equal(char *path,char *extension)

{
  int iVar1;
  char *__s2;
  char *in_RSI;
  char *in_RDI;
  char *ext2;
  char *ext1;
  undefined4 local_4;
  
  if ((in_RDI == (char *)0x0) || (in_RSI == (char *)0x0)) {
    local_4 = 0;
  }
  else {
    __s2 = ma_path_extension(in_RDI);
    iVar1 = strcasecmp(in_RSI,__s2);
    local_4 = (uint)(iVar1 == 0);
  }
  return local_4;
}

Assistant:

static ma_bool32 ma_path_extension_equal(const char* path, const char* extension)
{
    const char* ext1;
    const char* ext2;

    if (path == NULL || extension == NULL) {
        return MA_FALSE;
    }

    ext1 = extension;
    ext2 = ma_path_extension(path);

#if defined(_MSC_VER) || defined(__DMC__)
    return _stricmp(ext1, ext2) == 0;
#else
    return strcasecmp(ext1, ext2) == 0;
#endif
}